

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  u16 uVar1;
  ushort uVar2;
  u32 uVar3;
  uint uVar4;
  sqlite3_io_methods *psVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint *__s;
  ht_slot *aTmp;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  u64 n;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  u32 *puVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  int nMerge;
  int nList;
  int isChanged;
  ht_slot *aMerge;
  i64 nSize;
  i64 nReq;
  uint local_194;
  ulong local_190;
  u32 *local_188;
  int local_17c;
  long local_178;
  ht_slot *local_170;
  long local_168;
  ulong local_160;
  uint local_154;
  ulong local_150;
  ulong local_148;
  uint *local_140;
  sqlite3 *local_138;
  WalHashLoc local_130;
  ulong local_118;
  long local_110;
  long local_108;
  uint local_100 [52];
  
  local_17c = 0;
  uVar7 = 8;
  if (pWal->readOnly == '\0') {
    uVar6 = 0;
    local_138 = db;
    if (pWal->exclusiveMode == '\0') {
      uVar6 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,10);
    }
    iVar19 = eMode;
    if (uVar6 == 0) {
      pWal->ckptLock = '\x01';
      if (eMode == 0) {
        uVar6 = 0;
        iVar19 = 0;
      }
      else {
        do {
          uVar6 = 0;
          if (pWal->exclusiveMode == '\0') {
            uVar6 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
          }
        } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar6 == 5)) &&
                (iVar8 = (*xBusy)(pBusyArg), iVar8 != 0));
        if (uVar6 == 5) {
          uVar6 = 0;
          xBusy = (_func_int_void_ptr *)0x0;
          iVar19 = 0;
        }
        else if (uVar6 == 0) {
          pWal->writeLock = '\x01';
          uVar6 = 0;
        }
      }
    }
    if ((uVar6 == 0) && (uVar6 = walIndexReadHdr(pWal,&local_17c), local_17c != 0)) {
      psVar5 = pWal->pDbFd->pMethods;
      if (2 < psVar5->iVersion) {
        (*psVar5->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
      }
    }
    if (uVar6 == 0) {
      uVar7 = (pWal->hdr).mxFrame;
      if ((uVar7 == 0) || (uVar1 = (pWal->hdr).szPage, (CONCAT22(uVar1,uVar1) & 0x1fe00) == nBuf)) {
        uVar1 = (pWal->hdr).szPage;
        puVar18 = *pWal->apWiData;
        if (puVar18[0x18] < uVar7) {
          uVar11 = CONCAT22(uVar1,uVar1) & 0x1fe00;
          local_148 = (ulong)(pWal->hdr).nPage;
          uVar6 = 0;
          lVar20 = 1;
          local_188 = puVar18;
          do {
            uVar16 = puVar18[lVar20 + 0x19];
            if (uVar16 < uVar7) {
              iVar13 = (int)lVar20 + 3;
              do {
                uVar6 = 0;
                if (pWal->exclusiveMode == '\0') {
                  uVar6 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar13,1,10);
                }
              } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar6 == 5)) &&
                      (iVar8 = (*xBusy)(pBusyArg), iVar8 != 0));
              puVar18 = local_188;
              if (uVar6 == 5) {
                iVar8 = 0;
                xBusy = (_func_int_void_ptr *)0x0;
                uVar7 = uVar16;
              }
              else {
                iVar8 = 5;
                if (uVar6 == 0) {
                  uVar6 = 0xffffffff;
                  if (lVar20 == 1) {
                    uVar6 = uVar7;
                  }
                  local_188[lVar20 + 0x19] = uVar6;
                  iVar8 = 0;
                  if (pWal->exclusiveMode == '\0') {
                    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar13,1,9);
                  }
                  uVar6 = 0;
                  puVar18 = local_188;
                }
              }
            }
            else {
              iVar8 = 0;
            }
            if (iVar8 != 0) {
              if (iVar8 != 5) goto LAB_0014fe56;
              __s = (uint *)0x0;
              goto LAB_0014fe4e;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != 5);
          if (puVar18[0x18] < uVar7) {
            uVar3 = puVar18[0x18];
            uVar6 = (pWal->hdr).mxFrame;
            local_150 = (ulong)uVar6;
            uVar21 = (ulong)(uVar6 + 0x1000) + 0xffffffff021 >> 0xc;
            local_168 = uVar21 << 0x20;
            n = (local_168 >> 0x1b) + local_150 * 2 + 0x28;
            iVar8 = sqlite3_initialize();
            if (iVar8 == 0) {
              __s = (uint *)sqlite3Malloc(n);
            }
            else {
              __s = (uint *)0x0;
            }
            if (__s == (uint *)0x0) {
              uVar6 = 7;
              __s = (uint *)0x0;
            }
            else {
              iVar8 = (int)uVar21;
              memset(__s,0,n);
              __s[1] = iVar8 + 1;
              iVar13 = sqlite3_initialize();
              if (iVar13 == 0) {
                uVar6 = 0x1000;
                if ((uint)local_150 < 0x1000) {
                  uVar6 = (uint)local_150;
                }
                aTmp = (ht_slot *)sqlite3Malloc((ulong)(uVar6 * 2));
              }
              else {
                aTmp = (ht_slot *)0x0;
              }
              bVar22 = aTmp != (ht_slot *)0x0;
              uVar6 = 7;
              if (bVar22) {
                uVar6 = 0;
                iVar13 = (int)((ulong)(uVar3 + 0x1001) + 0xffffffff021 >> 0xc);
                if (iVar13 <= iVar8) {
                  local_140 = __s + 2;
                  lVar20 = (long)iVar13;
                  local_168 = local_168 >> 0x20;
                  do {
                    uVar6 = walHashGet(pWal,(int)lVar20,&local_130);
                    puVar18 = local_130.aPgno;
                    bVar22 = uVar6 == 0;
                    lVar10 = lVar20;
                    if (bVar22) {
                      if (lVar20 == local_168) {
                        local_190 = (ulong)((int)local_150 - local_130.iZero);
                      }
                      else {
                        local_190 = (ulong)((long)local_130.aHash - (long)local_130.aPgno) >> 2;
                      }
                      local_178 = (long)local_140 +
                                  (ulong)local_130.iZero * 2 + (long)(int)__s[1] * 0x20;
                      local_154 = local_130.iZero + 1;
                      uVar21 = local_190 & 0xffffffff;
                      if (0 < (int)local_190) {
                        uVar9 = 0;
                        do {
                          *(short *)(local_178 + uVar9 * 2) = (short)uVar9;
                          uVar9 = uVar9 + 1;
                        } while (uVar21 != uVar9);
                      }
                      local_194 = 0;
                      local_170 = (ht_slot *)0x0;
                      local_130.iZero = local_154;
                      local_110 = lVar20;
                      memset(&local_108,0,0xd0);
                      if ((int)local_190 < 1) {
                        uVar16 = 1;
                      }
                      else {
                        uVar9 = 0;
                        local_160 = uVar21;
                        local_118 = (ulong)uVar6;
                        do {
                          local_194 = 1;
                          local_170 = (ht_slot *)(local_178 + uVar9 * 2);
                          uVar21 = 0;
                          if ((uVar9 & 1) != 0) {
                            uVar21 = 0;
                            do {
                              walMerge(puVar18,*(ht_slot **)(local_100 + uVar21 * 4),
                                       local_100[(uVar21 * 2 + -1) * 2],&local_170,(int *)&local_194
                                       ,aTmp);
                              uVar6 = (int)uVar21 + 1;
                              uVar21 = (ulong)uVar6;
                            } while (((uint)uVar9 >> (uVar6 & 0x1f) & 1) != 0);
                          }
                          *(ht_slot **)(local_100 + uVar21 * 4) = local_170;
                          local_100[(uVar21 * 2 + -1) * 2] = local_194;
                          uVar9 = uVar9 + 1;
                        } while (uVar9 != local_160);
                        uVar16 = (int)uVar21 + 1;
                        uVar6 = (uint)local_118;
                      }
                      if (uVar16 < 0xd) {
                        uVar9 = (ulong)uVar16;
                        puVar17 = local_100 + uVar9 * 4;
                        uVar21 = local_190;
                        do {
                          if (((uint)uVar21 >> ((uint)uVar9 & 0x1f) & 1) != 0) {
                            walMerge(puVar18,*(ht_slot **)puVar17,puVar17[-2],&local_170,
                                     (int *)&local_194,aTmp);
                            uVar21 = local_190;
                          }
                          uVar9 = uVar9 + 1;
                          puVar17 = puVar17 + 4;
                        } while ((int)uVar9 != 0xd);
                      }
                      local_140[local_110 * 8 + 7] = local_154;
                      local_140[local_110 * 8 + 6] = local_194;
                      *(long *)(local_140 + local_110 * 8 + 2) = local_178;
                      *(u32 **)(local_140 + local_110 * 8 + 4) = puVar18;
                      lVar10 = local_110;
                    }
                  } while ((uVar6 == 0) && (lVar20 = lVar10 + 1, lVar10 < local_168));
                }
              }
              sqlite3_free(aTmp);
              puVar18 = local_188;
              if (!bVar22) {
                sqlite3_free(__s);
                __s = (uint *)0x0;
                puVar18 = local_188;
              }
            }
          }
          else {
            __s = (uint *)0x0;
          }
          if (__s != (uint *)0x0) {
            do {
              uVar6 = 0;
              if (pWal->exclusiveMode == '\0') {
                uVar6 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,10);
              }
            } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar6 == 5)) &&
                    (iVar8 = (*xBusy)(pBusyArg), iVar8 != 0));
            if (uVar6 == 0) {
              local_178 = CONCAT44(local_178._4_4_,puVar18[0x18]);
              puVar18[0x20] = uVar7;
              uVar16 = (uint)sync_flags >> 2 & 3;
              if (uVar16 == 0) {
                uVar6 = 0;
              }
              else {
                uVar6 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar16);
              }
              local_190 = (ulong)uVar11;
              if (uVar6 == 0) {
                local_108 = local_148 * local_190;
                psVar5 = pWal->pDbFd->pMethods;
                if (psVar5 != (sqlite3_io_methods *)0x0) {
                  (*psVar5->xFileControl)(pWal->pDbFd,0x27,(void *)0x0);
                }
                uVar6 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,(sqlite3_int64 *)&local_130)
                ;
                if ((uVar6 == 0) && (uVar6 = 0, (long)local_130.aHash < local_108)) {
                  if ((long)((long)local_130.aHash + (pWal->hdr).mxFrame * local_190 + 0x10000) <
                      local_108) {
                    uVar6 = 0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfddd,
                                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
                  }
                  else {
                    psVar5 = pWal->pDbFd->pMethods;
                    if (psVar5 != (sqlite3_io_methods *)0x0) {
                      (*psVar5->xFileControl)(pWal->pDbFd,5,&local_108);
                    }
                  }
                }
              }
              local_160 = (ulong)(uVar11 | 0x18);
              uVar15 = 0;
              do {
                if (uVar6 != 0) break;
                if ((long)(int)__s[1] < 1) {
                  uVar12 = 0xffffffff;
                }
                else {
                  uVar6 = *__s;
                  uVar12 = 0xffffffff;
                  lVar20 = (long)(int)__s[1];
                  do {
                    lVar10 = lVar20 + -1;
                    puVar17 = __s + lVar10 * 8 + 2;
                    uVar14 = __s[lVar10 * 8 + 2];
                    do {
                      if ((int)__s[lVar10 * 8 + 8] <= (int)uVar14) break;
                      uVar2 = *(ushort *)(*(long *)(puVar17 + 2) + (long)(int)uVar14 * 2);
                      uVar4 = *(uint *)(*(long *)(puVar17 + 4) + (ulong)uVar2 * 4);
                      if (uVar6 < uVar4) {
                        if (uVar4 < uVar12) {
                          uVar15 = (uint)uVar2 + puVar17[7];
                          uVar12 = uVar4;
                        }
                      }
                      else {
                        uVar14 = uVar14 + 1;
                        *puVar17 = uVar14;
                      }
                    } while (uVar4 <= uVar6);
                    bVar22 = 1 < lVar20;
                    lVar20 = lVar10;
                  } while (bVar22);
                }
                *__s = uVar12;
                if (uVar12 == 0xffffffff) {
                  uVar6 = 0;
                  break;
                }
                if ((local_138->u1).isInterrupted == 0) {
                  bVar22 = false;
                  if (((uint)local_178 < uVar15) && (uVar15 <= uVar7)) {
                    uVar6 = 0;
                    if (uVar12 <= (uint)local_148) {
                      uVar6 = (*pWal->pWalFd->pMethods->xRead)
                                        (pWal->pWalFd,zBuf,uVar11,(uVar15 - 1) * local_160 + 0x38);
                      if (uVar6 == 0) {
                        uVar6 = (*pWal->pDbFd->pMethods->xWrite)
                                          (pWal->pDbFd,zBuf,uVar11,(uVar12 - 1) * local_190);
                        bVar22 = uVar6 != 0;
                      }
                      else {
                        bVar22 = true;
                      }
                    }
                  }
                  else {
                    uVar6 = 0;
                  }
                }
                else {
                  uVar6 = (uint)(local_138->mallocFailed == '\0') * 2 + 7;
                  bVar22 = true;
                }
              } while (!bVar22);
              psVar5 = pWal->pDbFd->pMethods;
              if (psVar5 != (sqlite3_io_methods *)0x0) {
                (*psVar5->xFileControl)(pWal->pDbFd,0x25,(void *)0x0);
              }
              puVar18 = local_188;
              if (uVar6 == 0) {
                uVar6 = 0;
                if (((uVar7 == (*pWal->apWiData)[4]) &&
                    (uVar6 = (*pWal->pDbFd->pMethods->xTruncate)
                                       (pWal->pDbFd,(pWal->hdr).nPage * local_190), uVar16 != 0)) &&
                   (uVar6 == 0)) {
                  uVar6 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,uVar16);
                }
                if (uVar6 == 0) {
                  puVar18[0x18] = uVar7;
                  uVar6 = 0;
                }
              }
              if (pWal->exclusiveMode == '\0') {
                (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,9);
              }
            }
          }
          if (uVar6 == 5) {
            uVar6 = 0;
          }
        }
        else {
          __s = (uint *)0x0;
          uVar6 = 0;
        }
        if (((iVar19 != 0) && (uVar6 == 0)) &&
           ((uVar6 = 5, (pWal->hdr).mxFrame <= puVar18[0x18] && (uVar6 = 0, 1 < iVar19)))) {
          sqlite3_randomness(4,&local_108);
          do {
            uVar6 = 0;
            if (pWal->exclusiveMode == '\0') {
              uVar6 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
            }
          } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar6 == 5)) &&
                  (iVar8 = (*xBusy)(pBusyArg), iVar8 != 0));
          if (uVar6 == 0) {
            uVar6 = 0;
            if (iVar19 == 3) {
              walRestartHdr(pWal,(u32)local_108);
              uVar6 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
            }
            if (pWal->exclusiveMode == '\0') {
              (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
            }
          }
        }
LAB_0014fe4e:
        sqlite3_free(__s);
      }
      else {
        uVar6 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x104ea,
                    "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      }
LAB_0014fe56:
      if ((uVar6 == 5) || (uVar6 == 0)) {
        if (pnLog != (int *)0x0) {
          *pnLog = (pWal->hdr).mxFrame;
        }
        if (pnCkpt != (int *)0x0) {
          *pnCkpt = (*pWal->apWiData)[0x18];
        }
      }
    }
    if (local_17c != 0) {
      (pWal->hdr).aSalt[0] = 0;
      (pWal->hdr).aSalt[1] = 0;
      (pWal->hdr).aCksum[0] = 0;
      (pWal->hdr).aCksum[1] = 0;
      (pWal->hdr).mxFrame = 0;
      (pWal->hdr).nPage = 0;
      (pWal->hdr).aFrameCksum[0] = 0;
      (pWal->hdr).aFrameCksum[1] = 0;
      (pWal->hdr).iVersion = 0;
      (pWal->hdr).unused = 0;
      (pWal->hdr).iChange = 0;
      (pWal->hdr).isInit = '\0';
      (pWal->hdr).bigEndCksum = '\0';
      (pWal->hdr).szPage = 0;
    }
    sqlite3WalEndWriteTransaction(pWal);
    if (pWal->ckptLock != '\0') {
      if (pWal->exclusiveMode == '\0') {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,9);
      }
      pWal->ckptLock = '\0';
    }
    uVar7 = 5;
    if (uVar6 != 0) {
      uVar7 = uVar6;
    }
    if (iVar19 == eMode) {
      uVar7 = uVar6;
    }
  }
  return uVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* Enable blocking locks, if possible. If blocking locks are successfully
  ** enabled, set xBusy2=0 so that the busy-handler is never invoked. */
  sqlite3WalDb(pWal, db);
  (void)walEnableBlocking(pWal);

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive
  ** "checkpoint" lock on the database file.
  ** EVIDENCE-OF: R-10421-19736 If any other process is running a
  ** checkpoint operation at the same time, the lock cannot be obtained and
  ** SQLITE_BUSY is returned.
  ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
  ** it will not be invoked in this case.
  */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  testcase( rc==SQLITE_BUSY );
  testcase( rc!=SQLITE_OK && xBusy2!=0 );
  if( rc==SQLITE_OK ){
    pWal->ckptLock = 1;

    /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
    ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
    ** file.
    **
    ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
    ** immediately, and a busy-handler is configured, it is invoked and the
    ** writer lock retried until either the busy-handler returns 0 or the
    ** lock is successfully obtained.
    */
    if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
      rc = walBusyLock(pWal, xBusy2, pBusyArg, WAL_WRITE_LOCK, 1);
      if( rc==SQLITE_OK ){
        pWal->writeLock = 1;
      }else if( rc==SQLITE_BUSY ){
        eMode2 = SQLITE_CHECKPOINT_PASSIVE;
        xBusy2 = 0;
        rc = SQLITE_OK;
      }
    }
  }


  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    walDisableBlocking(pWal);
    rc = walIndexReadHdr(pWal, &isChanged);
    (void)walEnableBlocking(pWal);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  walDisableBlocking(pWal);
  sqlite3WalDb(pWal, 0);

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  if( pWal->ckptLock ){
    walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
    pWal->ckptLock = 0;
  }
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}